

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::ines_header_bytes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint8_t mapper_id,
          uint8_t prg_rom_size,uint8_t chr_rom_size,uint8_t prg_ram_size)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,0x10,'\0');
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar1[0] = 'N';
  pcVar1[1] = 'E';
  pcVar1[2] = 'S';
  pcVar1[3] = '\x1a';
  pcVar1[4] = mapper_id;
  pcVar1[5] = prg_rom_size;
  pcVar1[6] = (byte)this << 4;
  pcVar1[7] = (byte)this & 0xf0;
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ines_header_bytes(const uint8_t mapper_id,
        const uint8_t prg_rom_size,
        const uint8_t chr_rom_size,
        const uint8_t prg_ram_size) {
    INesHeader header{};
    header.flags_6 =
            static_cast<uint8_t>(mapper_id & static_cast<uint8_t>(0x0Fu)) << 4u;
    header.flags_7 =
            static_cast<uint8_t>(mapper_id & static_cast<uint8_t>(0xF0u));
    header.prg_rom_size = prg_rom_size;
    header.chr_rom_size = chr_rom_size;
    header.prg_ram_size = prg_ram_size;

    std::string bytes;
    bytes.resize(sizeof(header));

    char *const raw = bytes.data();
    std::memcpy(raw, &header, sizeof(header));

    return bytes;
}